

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDouble(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int fVerbose;
  int nFrames;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"vh");
      if (iVar2 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar2 = Abc_NtkIsSopLogic(pAVar3);
        if (iVar2 == 0) {
          Abc_Print(-1,"Only works for logic SOP networks.\n");
          return 1;
        }
        pAVar3 = Abc_NtkDouble(pAVar3);
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Command has failed.\n");
          return 0;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
        return 0;
      }
      if (iVar2 == 0x46) break;
      if ((iVar2 == 0x68) || (iVar2 != 0x76)) goto LAB_00237dbd;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (argc <= globalUtilOptind) break;
    iVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_00237dbd:
      Abc_Print(-2,"usage: double [-vh]\n");
      Abc_Print(-2,"\t         puts together two parallel copies of the current network\n");
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_00237dbd;
}

Assistant:

int Abc_CommandDouble( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int nFrames;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkDouble( Abc_Ntk_t * pNtk );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames    = 50;
    fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Only works for logic SOP networks.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkDouble( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: double [-vh]\n" );
    Abc_Print( -2, "\t         puts together two parallel copies of the current network\n" );
//    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}